

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O1

base_learner * ftrl_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  vw *pvVar2;
  size_t *psVar3;
  undefined8 uVar4;
  int iVar5;
  uint32_t uVar6;
  option_group_definition *poVar7;
  ostream *poVar8;
  typed_option<unsigned_long> *ptVar9;
  size_t sVar10;
  learner<ftrl,_example> *plVar11;
  uint32_t *puVar12;
  code *predict;
  code *pcVar13;
  float fVar14;
  bool coin;
  bool pistol;
  bool ftrl_option;
  free_ptr<ftrl> b;
  string algorithm_name;
  option_group_definition new_options;
  bool local_4fb;
  bool local_4fa;
  bool local_4f9;
  free_ptr<ftrl> local_4f8;
  undefined1 local_4e8 [112];
  bool local_478;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  string local_448;
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  string local_408;
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  string local_3c8;
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  string local_388;
  undefined1 *local_368;
  long local_360;
  undefined1 local_358 [16];
  option_group_definition local_348;
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  string local_2f0;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>._M_head_impl
       = calloc_or_throw<ftrl>(1);
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->all = (vw *)0x0;
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->ftrl_alpha = 0.0;
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->ftrl_beta = 0.0;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).update = 0.0;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_alpha = 0.0;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_beta = 0.0;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l1_lambda = 0.0;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l2_lambda = 0.0;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).predict = 0.0;
  *(undefined8 *)
   &((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
     _M_head_impl)->data).normalized_squared_norm_x = 0;
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->early_stop_thres = 0;
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->total_weight = 0.0;
  local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<ftrl>;
  local_4f9 = false;
  local_4fa = false;
  local_4fb = false;
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_368,"Follow the Regularized Leader","");
  local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_348,local_368,local_368 + local_360);
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"ftrl","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_4e8,&local_388,&local_4f9);
  local_478 = true;
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a8,"FTRL: Follow the Proximal Regularized Leader","");
  std::__cxx11::string::_M_assign((string *)(local_4e8 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_348,(typed_option<bool> *)local_4e8);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"coin","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_3c8,&local_4fb);
  local_240 = true;
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Coin betting optimizer","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_2b0);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"pistol","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_408,&local_4fa);
  local_1a0 = true;
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_428,"PiSTOL: Parameter-free STOchastic Learning","");
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_210);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ftrl_alpha","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_d0,&local_448,
             &(local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
              ._M_head_impl)->ftrl_alpha);
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d0,"Learning rate for FTRL optimization","");
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar7,(typed_option<float> *)local_d0);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"ftrl_beta","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_170,&local_2f0,
             &(local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
              ._M_head_impl)->ftrl_beta);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,"Learning rate for FTRL optimization","");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (poVar7,(typed_option<float> *)local_170);
  if (local_310[0] != local_300) {
    operator_delete(local_310[0]);
  }
  local_170._0_8_ = &PTR__typed_option_002d50c0;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0]);
  }
  local_d0._0_8_ = &PTR__typed_option_002d50c0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  if (local_428[0] != local_418) {
    operator_delete(local_428[0]);
  }
  local_210._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  if (local_3a8[0] != local_398) {
    operator_delete(local_3a8[0]);
  }
  local_4e8._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
  }
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options);
  if (local_4f9 != false) {
    pp_Var1 = (_func_int **)(local_4e8 + 0x10);
    local_4e8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_alpha","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_4e8);
    if ((char)iVar5 == '\0') {
      fVar14 = 0.005;
    }
    else {
      fVar14 = (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
    }
    (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_alpha = fVar14;
    if ((_func_int **)local_4e8._0_8_ != pp_Var1) {
      operator_delete((void *)local_4e8._0_8_);
    }
    local_4e8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_beta","");
    iVar5 = (*options->_vptr_options_i[1])(options);
    if ((char)iVar5 != '\0') goto LAB_001e9d38;
    fVar14 = 0.1;
    goto LAB_001e9d4c;
  }
  if ((local_4fa == false) && (local_4fb == false)) {
    plVar11 = (learner<ftrl,_example> *)0x0;
    goto LAB_001ea246;
  }
  if (local_4fa == true) {
    pp_Var1 = (_func_int **)(local_4e8 + 0x10);
    local_4e8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_alpha","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_4e8);
    if ((char)iVar5 == '\0') {
      fVar14 = 1.0;
    }
    else {
      fVar14 = (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
    }
    (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_alpha = fVar14;
    if ((_func_int **)local_4e8._0_8_ != pp_Var1) {
      operator_delete((void *)local_4e8._0_8_);
    }
    local_4e8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_beta","");
    iVar5 = (*options->_vptr_options_i[1])(options);
    if ((char)iVar5 == '\0') {
      fVar14 = 0.5;
    }
    else {
LAB_001e9d38:
      fVar14 = (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_beta;
    }
LAB_001e9d4c:
    (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_beta = fVar14;
    if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
      operator_delete((void *)local_4e8._0_8_);
    }
  }
  else if (local_4fb == true) {
    pp_Var1 = (_func_int **)(local_4e8 + 0x10);
    local_4e8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_alpha","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_4e8);
    if ((char)iVar5 == '\0') {
      fVar14 = 4.0;
    }
    else {
      fVar14 = (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha;
    }
    (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->ftrl_alpha = fVar14;
    if ((_func_int **)local_4e8._0_8_ != pp_Var1) {
      operator_delete((void *)local_4e8._0_8_);
    }
    local_4e8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"ftrl_beta","");
    iVar5 = (*options->_vptr_options_i[1])(options);
    if ((char)iVar5 != '\0') goto LAB_001e9d38;
    fVar14 = 1.0;
    goto LAB_001e9d4c;
  }
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->all = all;
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->all->normalized_sum_norm_x = 0.0;
  (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
  _M_head_impl)->total_weight = 0.0;
  pp_Var1 = (_func_int **)(local_4e8 + 0x10);
  local_4e8._8_8_ = (pointer)0x0;
  local_4e8[0x10] = 0;
  local_4e8._0_8_ = pp_Var1;
  if (local_4f9 == true) {
    std::__cxx11::string::_M_replace((ulong)local_4e8,0,(char *)0x0,0x281207);
    pcVar13 = learn_proximal<false>;
    if (all->audit != false) {
      pcVar13 = learn_proximal<true>;
    }
    uVar6 = 2;
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,2);
    }
    else {
LAB_001e9f5c:
      (all->weights).dense_weights._stride_shift = uVar6;
    }
  }
  else if (local_4fa == true) {
    std::__cxx11::string::_M_replace((ulong)local_4e8,0,(char *)0x0,0x281215);
    if ((all->weights).sparse != true) {
      pcVar13 = learn_pistol;
      uVar6 = 2;
      goto LAB_001e9f5c;
    }
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,2);
    pcVar13 = learn_pistol;
  }
  else if (local_4fb == true) {
    std::__cxx11::string::_M_replace((ulong)local_4e8,0,(char *)0x0,0x28121c);
    if ((all->weights).sparse != true) {
      pcVar13 = learn_cb;
      uVar6 = 3;
      goto LAB_001e9f5c;
    }
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,3);
    pcVar13 = learn_cb;
  }
  else {
    pcVar13 = (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)0x0;
  }
  fVar14 = (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
           _M_head_impl)->ftrl_beta;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_alpha =
       (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
       _M_head_impl)->ftrl_alpha;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).ftrl_beta = fVar14;
  pvVar2 = (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
           _M_head_impl)->all;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l1_lambda = pvVar2->l1_lambda;
  ((local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
   _M_head_impl)->data).l2_lambda = pvVar2->l2_lambda;
  if (all->quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Enabling FTRL based optimization",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Algorithm used: ",0x10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_4e8._0_8_,local_4e8._8_8_);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ftrl_alpha = ",0xd);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)(local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                                 super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_alpha);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ftrl_beta = ",0xc);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)(local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
                                 super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_ftrl_*,_false>._M_head_impl)->ftrl_beta);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"early_terminate","");
    ptVar9 = VW::config::options_i::get_typed_option<unsigned_long>(options,(string *)local_2b0);
    psVar3 = (ptVar9->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (psVar3 == (size_t *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = *psVar3;
    }
    (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
    _M_head_impl)->early_stop_thres = sVar10;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
  }
  predict = predict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    predict = predict<true>;
  }
  puVar12 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar12 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar11 = LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                      (&local_4f8,pcVar13,predict,1L << ((byte)*puVar12 & 0x3f));
  uVar4 = *(undefined8 *)(plVar11 + 0x18);
  *(undefined8 *)(plVar11 + 0x48) = uVar4;
  *(code **)(plVar11 + 0x50) = sensitivity;
  pcVar13 = multipredict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    pcVar13 = multipredict<true>;
  }
  *(code **)(plVar11 + 0x40) = pcVar13;
  *(code **)(plVar11 + 0x80) = save_load;
  *(undefined8 *)(plVar11 + 0x70) = uVar4;
  *(undefined8 *)(plVar11 + 0x78) = *(undefined8 *)(plVar11 + 0x20);
  *(undefined8 *)(plVar11 + 0x88) = uVar4;
  *(undefined8 *)(plVar11 + 0x90) = *(undefined8 *)(plVar11 + 0x20);
  *(code **)(plVar11 + 0x98) = end_pass;
  if ((_func_int **)local_4e8._0_8_ != pp_Var1) {
    operator_delete((void *)local_4e8._0_8_);
  }
LAB_001ea246:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_348.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
    operator_delete(local_348.m_name._M_dataplus._M_p);
  }
  if (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
      _M_head_impl != (ftrl *)0x0) {
    (*(code *)local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_4f8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
               ._M_head_impl);
  }
  return (base_learner *)plVar11;
}

Assistant:

base_learner* ftrl_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<ftrl>();
  bool ftrl_option = false;
  bool pistol = false;
  bool coin = false;

  option_group_definition new_options("Follow the Regularized Leader");
  new_options.add(make_option("ftrl", ftrl_option).keep().help("FTRL: Follow the Proximal Regularized Leader"))
      .add(make_option("coin", coin).keep().help("Coin betting optimizer"))
      .add(make_option("pistol", pistol).keep().help("PiSTOL: Parameter-free STOchastic Learning"))
      .add(make_option("ftrl_alpha", b->ftrl_alpha).help("Learning rate for FTRL optimization"))
      .add(make_option("ftrl_beta", b->ftrl_beta).help("Learning rate for FTRL optimization"));
  options.add_and_parse(new_options);

  if (!ftrl_option && !pistol && !coin)
  {
    return nullptr;
  }

  // Defaults that are specific to the mode that was chosen.
  if (ftrl_option)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 0.005f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.1f;
  }
  else if (pistol)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 1.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.5f;
  }
  else if (coin)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 4.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 1.0f;
  }


  b->all = &all;
  b->no_win_counter = 0;
  b->all->normalized_sum_norm_x = 0;
  b->total_weight = 0.;

  void (*learn_ptr)(ftrl&, single_learner&, example&) = nullptr;

  string algorithm_name;
  if (ftrl_option)
  {
    algorithm_name = "Proximal-FTRL";
    if (all.audit)
      learn_ptr = learn_proximal<true>;
    else
      learn_ptr = learn_proximal<false>;
      all.weights.stride_shift(2);  // NOTE: for more parameter storage
  }
  else if (pistol)
  {
    algorithm_name = "PiSTOL";
    learn_ptr = learn_pistol;
    all.weights.stride_shift(2);  // NOTE: for more parameter storage
  }
  else if (coin)
  {
    algorithm_name = "Coin Betting";
    learn_ptr = learn_cb;
    all.weights.stride_shift(3);  // NOTE: for more parameter storage
  }

  b->data.ftrl_alpha = b->ftrl_alpha;
  b->data.ftrl_beta = b->ftrl_beta;
  b->data.l1_lambda = b->all->l1_lambda;
  b->data.l2_lambda = b->all->l2_lambda;

  if (!all.quiet)
  {
    cerr << "Enabling FTRL based optimization" << endl;
    cerr << "Algorithm used: " << algorithm_name << endl;
    cerr << "ftrl_alpha = " << b->ftrl_alpha << endl;
    cerr << "ftrl_beta = " << b->ftrl_beta << endl;
  }

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  learner<ftrl, example>* l;
  if (all.audit || all.hash_inv)
    l = &init_learner(b, learn_ptr, predict<true>, UINT64_ONE << all.weights.stride_shift());
  else
    l = &init_learner(b, learn_ptr, predict<false>, UINT64_ONE << all.weights.stride_shift());
  l->set_sensitivity(sensitivity);
  if (all.audit || all.hash_inv)
    l->set_multipredict(multipredict<true>);
  else
    l->set_multipredict(multipredict<false>);
  l->set_save_load(save_load);
  l->set_end_pass(end_pass);
  return make_base(*l);
}